

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,quatf *value)

{
  value_type_conflict6 vVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  undefined1 local_30 [8];
  float4 v;
  quatf *value_local;
  AsciiParser *this_local;
  
  v._M_elems._8_8_ = value;
  bVar2 = ReadBasicType(this,(float4 *)local_30);
  if (bVar2) {
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,0);
    *(value_type_conflict6 *)(v._M_elems._8_8_ + 0xc) = *pvVar3;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,1);
    vVar1 = *pvVar3;
    pvVar4 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)v._M_elems._8_8_,0);
    *pvVar4 = vVar1;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,2);
    vVar1 = *pvVar3;
    pvVar4 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)v._M_elems._8_8_,1);
    *pvVar4 = vVar1;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,3);
    vVar1 = *pvVar3;
    pvVar4 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)v._M_elems._8_8_,2);
    *pvVar4 = vVar1;
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ReadBasicType(value::quatf *value) {
  value::float4 v;
  if (ReadBasicType(&v)) {
    value->real = v[0];
    value->imag[0] = v[1];
    value->imag[1] = v[2];
    value->imag[2] = v[3];
    return true;
  }
  return false;
}